

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O3

void outputMode(Problem *problem)

{
  Unit **ppUVar1;
  int iVar2;
  ostream *poVar3;
  Unit *extraout_RDX;
  Unit *extraout_RDX_00;
  Unit *extraout_RDX_01;
  Unit *unit;
  UnitList *pUVar4;
  ScopedPtr<Kernel::Problem> prb;
  string local_58;
  Problem *local_38;
  
  local_38 = problem;
  Shell::UIHelper::outputSymbolDeclarations((ostream *)&std::cout);
  pUVar4 = problem->_units;
  if (pUVar4 != (UnitList *)0x0) {
    unit = extraout_RDX;
    do {
      ppUVar1 = &pUVar4->_head;
      pUVar4 = pUVar4->_tail;
      Shell::TPTPPrinter::toString_abi_cxx11_(&local_58,(TPTPPrinter *)*ppUVar1,unit);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_58._M_dataplus._M_p,local_58._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      unit = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        unit = extraout_RDX_01;
      }
    } while (pUVar4 != (List<Kernel::Unit_*> *)0x0);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,*(long *)(Lib::env + 0x6a70),
             *(long *)(Lib::env + 0x6a78) + *(long *)(Lib::env + 0x6a70));
  iVar2 = std::__cxx11::string::compare((char *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (iVar2 != 0) {
    outputProblemToLaTeX(problem);
  }
  vampireReturnValue = 0;
  Kernel::Problem::~Problem(problem);
  operator_delete(problem,0x110);
  return;
}

Assistant:

void outputMode(Problem* problem)
{
  ScopedPtr<Problem> prb(problem);

  //outputSymbolDeclarations also deals with sorts for now
  //UIHelper::outputSortDeclarations(std::cout);
  UIHelper::outputSymbolDeclarations(std::cout);
  UnitList::Iterator units(prb->units());

  while (units.hasNext()) {
    Unit* u = units.next();
    std::cout << TPTPPrinter::toString(u) << "\n";
  }

  if(env.options->latexOutput()!="off"){ outputProblemToLaTeX(prb.ptr()); }

  //we have successfully output all clauses, so we'll terminate with zero return value
  vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
}